

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue36.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = faup_options_new();
  faup_init(uVar1);
  uVar1 = faup_options_new();
  uVar2 = faup_init(uVar1);
  faup_options_free(uVar1);
  faup_terminate(uVar2);
  return 0;
}

Assistant:

int main(void)
{
  faup_handler_t *fh = NULL;
  faup_options_t *faup_opts;

  faup_opts = faup_options_new();
  fh = faup_init(faup_opts);

  faup_opts = faup_options_new();
  fh = faup_init(faup_opts);

  faup_options_free(faup_opts);

  faup_terminate(fh);

  return 0;
}